

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

wchar_t * fmt::v5::internal::
          parse_arg_id<wchar_t,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>&,wchar_t>>
                    (wchar_t *begin,wchar_t *end,
                    id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_&,_wchar_t>
                    *handler)

{
  long lVar1;
  wchar_t *pwVar2;
  format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
  *pfVar3;
  wchar_t wVar4;
  long lVar5;
  uint id;
  basic_string_view<wchar_t> name;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>_1
  local_48;
  type local_38;
  
  wVar4 = *begin;
  if ((wVar4 == L'}') || (wVar4 == L':')) {
    pfVar3 = handler->handler;
    basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>
    ::next_arg((format_arg *)&local_48.string,&pfVar3->context);
    (pfVar3->arg).type_ = local_38;
    (pfVar3->arg).value_.field_0.long_long_value = local_48.long_long_value;
    (pfVar3->arg).value_.field_0.string.size = local_48.string.size;
  }
  else {
    if ((uint)(wVar4 + L'\xffffffd0') < 10) {
      begin = begin + 1;
      id = 0;
      pwVar2 = begin;
      if (wVar4 != L'0') {
        do {
          begin = pwVar2;
          if (0xccccccc < id) {
            begin = begin + -1;
            id = 0x80000000;
            goto LAB_00183891;
          }
          id = (wVar4 + id * 10) - 0x30;
          if (begin == end) break;
          wVar4 = *begin;
          pwVar2 = begin + 1;
        } while ((uint)(wVar4 + L'\xffffffd0') < 10);
        if ((int)id < 0) {
LAB_00183891:
          error_handler::on_error((error_handler *)handler->handler,"number is too big");
        }
      }
      if ((begin != end) && ((*begin == L':' || (*begin == L'}')))) {
        format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
        ::on_arg_id(handler->handler,id);
        return begin;
      }
    }
    else if ((wVar4 == L'_') || ((uint)((wVar4 & 0xffffffdfU) - 0x41U) < 0x1a)) {
      lVar1 = 4;
      do {
        lVar5 = lVar1;
        pwVar2 = (wchar_t *)((long)begin + lVar5);
        if (pwVar2 == end) break;
        wVar4 = *pwVar2;
        lVar1 = lVar5 + 4;
      } while ((((uint)(wVar4 + L'\xffffffd0') < 10) || (wVar4 == L'_')) ||
              ((uint)((wVar4 & 0xffffffdfU) - 0x41U) < 0x1a));
      name.size_ = lVar5 >> 2;
      pfVar3 = handler->handler;
      name.data_ = begin;
      basic_format_context<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>
      ::get_arg((format_arg *)&local_48.string,&pfVar3->context,name);
      (pfVar3->arg).type_ = local_38;
      (pfVar3->arg).value_.field_0.long_long_value = local_48.long_long_value;
      (pfVar3->arg).value_.field_0.string.size = local_48.string.size;
      return pwVar2;
    }
    error_handler::on_error((error_handler *)handler->handler,"invalid format string");
  }
  return begin;
}

Assistant:

FMT_CONSTEXPR const Char *parse_arg_id(
    const Char *begin, const Char *end, IDHandler &&handler) {
  assert(begin != end);
  Char c = *begin;
  if (c == '}' || c == ':')
    return handler(), begin;
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      return handler.on_error("invalid format string"), begin;
    handler(index);
    return begin;
  }
  if (!is_name_start(c))
    return handler.on_error("invalid format string"), begin;
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}